

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

size_t encoder_7bit_read(char *buffer,size_t size,_Bool ateof,curl_mimepart *part)

{
  char *pcVar1;
  char *local_48;
  char *local_40;
  size_t cursize;
  mime_encoder_state *st;
  curl_mimepart *part_local;
  char *pcStack_20;
  _Bool ateof_local;
  size_t size_local;
  char *buffer_local;
  
  pcVar1 = (char *)((part->encstate).bufend - (part->encstate).bufbeg);
  if (size == 0) {
    buffer_local = (char *)0xfffffffffffffffe;
  }
  else {
    pcStack_20 = (char *)size;
    if (pcVar1 < size) {
      pcStack_20 = pcVar1;
    }
    size_local = (size_t)buffer;
    for (local_40 = (char *)0x0; local_40 < pcStack_20; local_40 = local_40 + 1) {
      *(char *)size_local = (part->encstate).buf[(part->encstate).bufbeg];
      if (((int)*(char *)size_local & 0x80U) != 0) {
        if (local_40 == (char *)0x0) {
          local_48 = (char *)0xffffffffffffffff;
        }
        else {
          local_48 = local_40;
        }
        return (size_t)local_48;
      }
      (part->encstate).bufbeg = (part->encstate).bufbeg + 1;
      size_local = size_local + 1;
    }
    buffer_local = local_40;
  }
  return (size_t)buffer_local;
}

Assistant:

static size_t encoder_7bit_read(char *buffer, size_t size, bool ateof,
                                curl_mimepart *part)
{
  struct mime_encoder_state *st = &part->encstate;
  size_t cursize = st->bufend - st->bufbeg;

  (void) ateof;

  if(!size)
    return STOP_FILLING;

  if(size > cursize)
    size = cursize;

  for(cursize = 0; cursize < size; cursize++) {
    *buffer = st->buf[st->bufbeg];
    if(*buffer++ & 0x80)
      return cursize? cursize: READ_ERROR;
    st->bufbeg++;
  }

  return cursize;
}